

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

CTPNStm * __thiscall CTcParser::parse_for(CTcParser *this,int *err)

{
  CTcPrsSymtab *pCVar1;
  CTPNStmEnclosing *pCVar2;
  bool bVar3;
  CTcTokenizer *this_00;
  int *piVar4;
  CTcSymLocal *pCVar5;
  tc_toktyp_t tVar6;
  int iVar7;
  CVmHashEntry *pCVar8;
  CVmHashEntry *pCVar9;
  CTcPrsNode *reinit_expr;
  CTPNStmFor *this_01;
  CTPNStm *pCVar10;
  CTcPrsNode *cond_expr;
  int *err_00;
  CVmHashEntry *lcl;
  char *siz;
  CVmHashEntry *init_expr;
  CTPNStmFor *pCVar11;
  bool bVar12;
  CTPNForIn *in_head;
  CTPNForIn *in_tail;
  _func_int **local_60;
  long local_58;
  CTcTokFileDesc *local_50;
  CTcPrsSymtab *local_48;
  CTcPrsSymtab *local_40;
  int *local_38;
  
  this_00 = G_tok;
  local_50 = G_tok->last_desc_;
  local_58 = G_tok->last_linenum_;
  pCVar1 = this->local_symtab_;
  local_48 = this->enclosing_local_symtab_;
  this->enclosing_local_symtab_ = pCVar1;
  lcl = (CVmHashEntry *)err;
  tVar6 = CTcTokenizer::next(this_00);
  local_40 = pCVar1;
  local_38 = err;
  if (tVar6 == TOKT_LPAR) {
    CTcTokenizer::next(G_tok);
  }
  else {
    lcl = (CVmHashEntry *)0x2b36;
    CTcTokenizer::log_error_curtok(G_tok,0x2b36);
  }
  in_head = (CTPNForIn *)0x0;
  in_tail = (CTPNForIn *)0x0;
  bVar12 = true;
  bVar3 = false;
  local_60 = (_func_int **)&PTR_gen_code_00311ae0;
  init_expr = (CVmHashEntry *)0x0;
LAB_0020330d:
  while (bVar12) {
    tVar6 = (G_tok->curtok_).typ_;
    if (tVar6 != TOKT_LOCAL) {
      if (1 < tVar6 - TOKT_LBRACE) {
        if (tVar6 != TOKT_RPAR) {
          if (tVar6 != TOKT_SEM) {
            pCVar8 = (CVmHashEntry *)parse_asi_expr(this);
            bVar12 = pCVar8 == (CVmHashEntry *)0x0;
            pCVar9 = pCVar8;
            if ((G_tok->curtok_).typ_ == TOKT_SYM) {
              lcl = (CVmHashEntry *)0x2b3fa2;
              iVar7 = CTcToken::text_matches(&G_tok->curtok_,"in",2);
              if (iVar7 != 0) {
                CTcTokenizer::next(G_tok);
                pCVar9 = (CVmHashEntry *)
                         parse_for_in_clause(this,(CTcPrsNode *)pCVar8,&in_head,&in_tail);
                if (pCVar9 == (CVmHashEntry *)0x0) {
                  bVar12 = true;
                }
                goto LAB_002033b5;
              }
            }
            goto LAB_0020343b;
          }
          if (init_expr == (CVmHashEntry *)0x0) {
            init_expr = (CVmHashEntry *)0x0;
          }
          else {
            CTcTokenizer::log_error(0x2b39);
          }
          break;
        }
        if (bVar3) break;
      }
      lcl = (CVmHashEntry *)0x2b3a;
      CTcTokenizer::log_error_curtok(G_tok,0x2b3a);
      break;
    }
    create_scope_local_symtab(this);
    tVar6 = CTcTokenizer::next(G_tok);
    pCVar5 = (CTcSymLocal *)0x2b29;
    if (tVar6 == TOKT_SYM) {
      iVar7 = this->local_cnt_;
      if (this->max_local_cnt_ <= iVar7) {
        this->max_local_cnt_ = iVar7 + 1;
      }
      this->local_cnt_ = iVar7 + 1;
      lcl = (CVmHashEntry *)CTcPrsSymtab::add_local(this->local_symtab_,iVar7);
      tVar6 = CTcTokenizer::next(G_tok);
      pCVar5 = (CTcSymLocal *)0x2b38;
      if (tVar6 == TOKT_SYM) {
        siz = "in";
        iVar7 = CTcToken::text_matches(&G_tok->curtok_,"in",2);
        if (iVar7 == 0) goto LAB_002034d0;
        CTcTokenizer::next(G_tok);
        pCVar8 = (CVmHashEntry *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x10,(size_t)siz);
        (((CTcSymLocal *)pCVar8)->super_CTcSymLocalBase).super_CTcSymbol.super_CTcSymbolBase.
        super_CVmHashEntryCS.super_CVmHashEntry.nxt_ = lcl;
        (((CTcSymLocal *)pCVar8)->super_CTcSymLocalBase).super_CTcSymbol.super_CTcSymbolBase.
        super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry = local_60;
        pCVar9 = (CVmHashEntry *)parse_for_in_clause(this,(CTcPrsNode *)pCVar8,&in_head,&in_tail);
        bVar12 = pCVar9 == (CVmHashEntry *)0x0;
LAB_002033b5:
        bVar3 = true;
        lcl = pCVar8;
      }
      else {
        if ((tVar6 != TOKT_ASI) && (tVar6 != TOKT_EQ)) goto LAB_002034d0;
        pCVar9 = (CVmHashEntry *)parse_local_initializer(this,(CTcSymLocal *)lcl,err_00);
        bVar12 = false;
      }
LAB_0020343b:
      pCVar8 = init_expr;
      if ((pCVar9 != (CVmHashEntry *)0x0) && (pCVar8 = pCVar9, init_expr != (CVmHashEntry *)0x0)) {
        pCVar8 = (CVmHashEntry *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,(size_t)lcl);
        pCVar8->nxt_ = init_expr;
        pCVar8->str_ = (char *)pCVar9;
        (((CTcSymLocalBase *)&pCVar8->_vptr_CVmHashEntry)->super_CTcSymbol).super_CTcSymbolBase.
        super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry =
             (_func_int **)&PTR_gen_code_0030f3e0;
      }
      init_expr = pCVar8;
      if (bVar12) break;
    }
    else {
LAB_002034d0:
      lcl = (CVmHashEntry *)pCVar5;
      CTcTokenizer::log_error_curtok(G_tok,(int)lcl);
    }
    tVar6 = (G_tok->curtok_).typ_;
    if (tVar6 - TOKT_LBRACE < 2) goto LAB_00203528;
    bVar12 = false;
    if (tVar6 == TOKT_RPAR) goto LAB_0020351d;
    if (tVar6 != TOKT_SEM) {
      if (tVar6 != TOKT_COMMA) {
        lcl = (CVmHashEntry *)0x2b3b;
        CTcTokenizer::log_error_curtok(G_tok,0x2b3b);
      }
      CTcTokenizer::next(G_tok);
      bVar12 = true;
    }
  }
  tVar6 = (G_tok->curtok_).typ_;
  if (tVar6 == TOKT_RPAR) {
    CTcTokenizer::next(G_tok);
  }
  else if (tVar6 == TOKT_SEM) {
    CTcTokenizer::next(G_tok);
    if ((G_tok->curtok_).typ_ == TOKT_SEM) {
      cond_expr = (CTcPrsNode *)0x0;
LAB_0020358e:
      CTcTokenizer::next(G_tok);
LAB_00203593:
      if ((G_tok->curtok_).typ_ == TOKT_RPAR) goto LAB_002036c3;
      reinit_expr = parse_expr(this);
    }
    else {
      cond_expr = parse_cond_expr(this);
      tVar6 = (G_tok->curtok_).typ_;
      if ((1 < tVar6 - TOKT_LBRACE) && (tVar6 != TOKT_RPAR)) {
        if (tVar6 == TOKT_SEM) goto LAB_0020358e;
        lcl = (CVmHashEntry *)0x2b3c;
        CTcTokenizer::log_error_curtok(G_tok,0x2b3c);
        goto LAB_00203593;
      }
      lcl = (CVmHashEntry *)0x2b3a;
      CTcTokenizer::log_error_curtok(G_tok,0x2b3a);
LAB_002036c3:
      reinit_expr = (CTcPrsNode *)0x0;
    }
    if ((G_tok->curtok_).typ_ == TOKT_RPAR) {
      CTcTokenizer::next(G_tok);
    }
    else {
      lcl = (CVmHashEntry *)0x2b3d;
      CTcTokenizer::log_error_curtok(G_tok,0x2b3d);
    }
    goto LAB_002035bf;
  }
  reinit_expr = (CTcPrsNode *)0x0;
  cond_expr = (CTcPrsNode *)0x0;
LAB_002035bf:
  this_01 = (CTPNStmFor *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x70,(size_t)lcl);
  CTPNStmFor::CTPNStmFor
            (this_01,(CTcPrsNode *)init_expr,cond_expr,reinit_expr,in_head,this->local_symtab_,
             this->enclosing_stm_);
  piVar4 = local_38;
  pCVar2 = this->enclosing_stm_;
  this->enclosing_stm_ = (CTPNStmEnclosing *)this_01;
  pCVar10 = parse_stm(this,local_38,(CTPNStmSwitch *)0x0,0);
  this->enclosing_stm_ = pCVar2;
  pCVar11 = (CTPNStmFor *)0x0;
  if (*piVar4 == 0) {
    (this_01->super_CTPNStmForBase).body_stm_ = pCVar10;
    (this_01->super_CTPNStmForBase).super_CTPNStmEnclosing.super_CTPNStm.super_CTPNStmBase.file_ =
         local_50;
    (this_01->super_CTPNStmForBase).super_CTPNStmEnclosing.super_CTPNStm.super_CTPNStmBase.linenum_
         = local_58;
    (this_01->super_CTPNStmForBase).field_0x58 =
         (this_01->super_CTPNStmForBase).field_0x58 & 0xfe | this->local_symtab_ != local_40;
    this->local_symtab_ = local_40;
    this->enclosing_local_symtab_ = local_48;
    pCVar11 = this_01;
  }
  return (CTPNStm *)pCVar11;
LAB_0020351d:
  if (!bVar3) {
LAB_00203528:
    lcl = (CVmHashEntry *)0x2b3a;
    CTcTokenizer::log_error_curtok(G_tok,0x2b3a);
    bVar12 = false;
  }
  goto LAB_0020330d;
}

Assistant:

CTPNStm *CTcParser::parse_for(int *err)
{
    /* save the current line information for later */
    CTcTokFileDesc *file;
    long linenum;
    G_tok->get_last_pos(&file, &linenum);

    /* 
     *   enter a scope, in case we create a local symbol table for local
     *   variables defined within the 'for' statement 
     */
    tcprs_scope_t scope_data;
    enter_scope(&scope_data);

    /* parse the open paren */
    if (G_tok->next() == TOKT_LPAR)
    {
        /* skip it */
        G_tok->next();
    }
    else
    {
        /* log an error, and proceed, assuming it was simply left out */
        G_tok->log_error_curtok(TCERR_REQ_FOR_LPAR);
    }

    /* we don't have any of the expressions yet */
    CTcPrsNode *init_expr = 0;
    CTcPrsNode *cond_expr = 0;
    CTcPrsNode *reinit_expr = 0;
    int found_in = FALSE;

    /* "in" expression list */
    CTPNForIn *in_head = 0, *in_tail = 0;

    /* parse the initializer list */
    for (int done = FALSE ; !done ; )
    {
        /* presume we won't find an expression on this round */
        CTcPrsNode *expr = 0;
        
        /* check what we have */
        switch(G_tok->cur())
        {
        case TOKT_LOCAL:
            /* 
             *   if we haven't created our own symbol table local to the
             *   'for' loop, do so now 
             */
            create_scope_local_symtab();
            
            /* skip the 'local' keyword and get the local name */
            if (G_tok->next() == TOKT_SYM)
            {
                /* add the local symbol */
                CTcSymLocal *lcl = local_symtab_->add_local(alloc_local());

                /* check for the required initializer */
                switch(G_tok->next())
                {
                case TOKT_ASI:
                case TOKT_EQ:
                    /* parse the initializer */
                    expr = parse_local_initializer(lcl, err);
                    break;

                case TOKT_SYM:
                    /* check for an 'in' expression */
                    if (G_tok->getcur()->text_matches("in", 2))
                    {
                        /* parse the 'var in expr' or 'var in from..to' */
                        G_tok->next();
                        expr = parse_for_in_clause(
                            new CTPNSymResolved(lcl), in_head, in_tail);

                        /* note the "in" */
                        found_in = TRUE;

                        /* if that failed, stop scanning the initializer */
                        if (expr == 0)
                            done = TRUE;
                    }
                    else
                    {
                        /* anything else is an error */
                        goto req_asi;
                    }
                    break;
                    
                default:
                req_asi:
                    /* log an error - an initializer is required */
                    G_tok->log_error_curtok(TCERR_REQ_FOR_LOCAL_INIT);
                    break;
                }
            }
            else
            {
                /* 
                 *   the 'local' statement isn't constructed properly -
                 *   this is difficult to recover from intelligently, so
                 *   just log an error and keep going from here 
                 */
                G_tok->log_error_curtok(TCERR_LOCAL_REQ_SYM);
                break;
            }
            break;

        case TOKT_SEM:
            /* it's a semicolon - we're done with the initializer list */
            done = TRUE;

            /* 
             *   if we have an expression already, it means that the
             *   previous token was a comma - this is an error, since we
             *   have a missing expression; log the error but continue
             *   anyway 
             */
            if (init_expr != 0)
                G_tok->log_error(TCERR_MISSING_FOR_INIT_EXPR);
            break;

        case TOKT_RPAR:
            /* if we found an "in", we can end early */
            if (found_in)
            {
                done = TRUE;
                break;
            }

            /* otherwise, fall through to the missing part error... */
            /* FALL THROUGH */

        case TOKT_LBRACE:
        case TOKT_RBRACE:
            /* premature end of the list - log an error and stop */
            G_tok->log_error_curtok(TCERR_MISSING_FOR_PART);
            done = TRUE;
            break;

        default:
            /* 
             *   This must be an expression - parse it.  Parse an
             *   assignment expression, not a comma expression, because we
             *   must check for a "local" clause after each comma. 
             */
            expr = parse_asi_expr();

            /* if that failed, stop scanning the "for" */
            if (expr == 0)
                done = TRUE;

            /* check for an 'in' expression */
            if (G_tok->cur() == TOKT_SYM
                && G_tok->getcur()->text_matches("in", 2))
            {
                /* skip the "in" and parse the collection/range */
                G_tok->next();
                expr = parse_for_in_clause(expr, in_head, in_tail);

                /* note the "in" */
                found_in = TRUE;
                
                /* if that failed, stop parsing the initializer */
                if (expr == 0)
                    done = TRUE;
            }

            /* done with this clause */
            break;
        }

        /* 
         *   if we got an expression, add it into the initializer
         *   expression under construction by adding it under a "comma"
         *   node 
         */
        if (expr != 0)
        {
            /* 
             *   if there's an expression, build a comma expression for
             *   the expression so far plus the new expression; otherwise,
             *   the new expression becomes the entire expression so far 
             */
            if (init_expr != 0)
                init_expr = new CTPNComma(init_expr, expr);
            else
                init_expr = expr;
        }

        /* if we're done, we can stop now */
        if (done)
            break;

        /* 
         *   we must have a semicolon or comma after each initializer
         *   expression 
         */
        switch(G_tok->cur())
        {
        case TOKT_SEM:
            /* that's the end of the statement - stop now */
            done = TRUE;
            break;

        case TOKT_COMMA:
            /* skip the comma and parse the next initializer */
            G_tok->next();
            break;

        case TOKT_RPAR:
            /* if we found an "in" clause, we only need an initializer */
            if (found_in)
            {
                done = TRUE;
                break;
            }

            /* otherwise, fall through to the error case... */
            /* FALL THROUGH */
            
        case TOKT_LBRACE:
        case TOKT_RBRACE:
            /* log an error, and stop parsing the expression list */
            G_tok->log_error_curtok(TCERR_MISSING_FOR_PART);
            done = TRUE;
            break;

        default:
            /* log an error */
            G_tok->log_error_curtok(TCERR_REQ_FOR_INIT_COMMA);

            /* skip the errant token and keep going */
            G_tok->next();
            break;
        }
    }

    /* 
     *   if we successfully found the ';' at the end of the initializer
     *   list, parse the condition expression 
     */
    if (G_tok->cur() == TOKT_SEM)
    {
        int cont_to_reinit;

        /* presume we'll want to continue to the reinit expression */
        cont_to_reinit = TRUE;

        /* skip the ';' */
        G_tok->next();
        
        /* if the condition isn't empty, parse it */
        if (G_tok->cur() != TOKT_SEM)
            cond_expr = parse_cond_expr();

        /* require the ';' after the expression */
        switch(G_tok->cur())
        {
        case TOKT_SEM:
            /* it's fine - keep going from here */
            G_tok->next();
            break;

        case TOKT_RPAR:
        case TOKT_LBRACE:
        case TOKT_RBRACE:
            /* missing part */
            G_tok->log_error_curtok(TCERR_MISSING_FOR_PART);

            /* don't bother trying to find a reinitialization expression */
            cont_to_reinit = FALSE;
            break;

        default:
            /* 
             *   we seem to be missing the semicolon; keep going from
             *   here, assuming that they simply left out the semicolon
             *   between the condition and reinitializer expressions 
             */
            G_tok->log_error_curtok(TCERR_REQ_FOR_COND_SEM);
            break;
        }

        /* 
         *   if we're to continue to the reinitializer, parse it; there is
         *   no reinitialization expression if the next token is a right
         *   paren 
         */
        if (cont_to_reinit && G_tok->cur() != TOKT_RPAR)
        {
            /* parse the expression */
            reinit_expr = parse_expr();
        }

        /* make sure we have the right paren */
        if (G_tok->cur() == TOKT_RPAR)
        {
            /* skip the paren */
            G_tok->next();
        }
        else
        {
            /* 
             *   log an error, and try parsing the body from here, on the
             *   assumption that they simply forgot about the right paren
             *   and jumped right into the body 
             */
            G_tok->log_error_curtok(TCERR_REQ_FOR_RPAR);
        }
    }
    else if (G_tok->cur() == TOKT_RPAR)
    {
        /* 
         *   We already found the right paren - early, so we logged an error
         *   if necessary (it's an error in most cases, but *not* if there's
         *   an 'in' clause in the initializer list).  Simply skip it now so
         *   that we can proceed to the body of the 'for'.  
         */
        G_tok->next();
    }

    /* create the "for" node */
    CTPNStmFor *for_stm = new CTPNStmFor(
        init_expr, cond_expr, reinit_expr, in_head,
        local_symtab_, enclosing_stm_);

    /* set the 'for' to enclose its body */
    CTPNStmEnclosing *old_enclosing = set_enclosing_stm(for_stm);

    /* parse the body of the "for" loop */
    CTPNStm *body_stm = parse_stm(err, 0, FALSE);

    /* restore the old enclosing statement */
    set_enclosing_stm(old_enclosing);

    /* if that failed, return failure */
    if (*err)
        return 0;

    /* set the body of the 'for' */
    for_stm->set_body(body_stm);

    /* set the original statement position in the node */
    for_stm->set_source_pos(file, linenum);

    /* set the own-scope flag */
    for_stm->set_has_own_scope(local_symtab_ != scope_data.local_symtab);

    /* exit any local scope we created */
    leave_scope(&scope_data);

    /* return the "for" node */
    return for_stm;
}